

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O1

void Abc_SclShortFormula(SC_Cell *pCell,char *pForm,char *pBuffer)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  byte bVar5;
  byte *pbVar6;
  size_t __n;
  ulong uVar7;
  byte *local_40;
  
  bVar3 = *pForm;
  local_40 = (byte *)pForm;
  do {
    if (bVar3 == 0) {
      *pBuffer = 0;
      return;
    }
    bVar5 = (bVar3 & 0xdf) + 0xa5;
    if (bVar3 == 0x5f || 0xe5 < bVar5) {
      if (bVar3 != 0x5f && bVar5 < 0xe6) {
        __assert_fail("Abc_SclIsChar(*pName)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLibUtil.c"
                      ,0x7b,"char *Abc_SclFindLimit(char *)");
      }
      pbVar6 = local_40 + -1;
      __n = 0xffffffffffffffff;
      do {
        do {
          bVar3 = pbVar6[1];
          pbVar6 = pbVar6 + 1;
          __n = __n + 1;
        } while (bVar3 == 0x5f);
      } while ((0xf5 < (byte)(bVar3 - 0x3a)) || (0xe5 < (byte)((bVar3 & 0xdf) + 0xa5)));
      uVar1 = pCell->n_inputs;
      if ((int)uVar1 < 1) {
        uVar7 = 0;
      }
      else {
        uVar2 = (pCell->vPins).nSize;
        if ((int)uVar2 < 1) {
          uVar2 = 0;
        }
        uVar7 = 0;
        do {
          if (uVar2 == uVar7) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          iVar4 = strncmp(*(pCell->vPins).pArray[uVar7],(char *)local_40,__n);
          if (iVar4 == 0) {
            *pBuffer = (char)uVar7 + 0x61;
            pBuffer = (char *)((byte *)pBuffer + 1);
            goto LAB_003d92cc;
          }
          uVar7 = uVar7 + 1;
        } while (uVar1 != uVar7);
        uVar7 = (ulong)uVar1;
      }
LAB_003d92cc:
      if (pCell->n_inputs <= (int)uVar7) {
        __assert_fail("i < pCell->n_inputs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLibUtil.c"
                      ,0x96,"void Abc_SclShortFormula(SC_Cell *, char *, char *)");
      }
    }
    else {
      pbVar6 = local_40 + 1;
      *pBuffer = bVar3;
      pBuffer = (char *)((byte *)pBuffer + 1);
    }
    bVar3 = *pbVar6;
    local_40 = pbVar6;
  } while( true );
}

Assistant:

void Abc_SclShortFormula( SC_Cell * pCell, char * pForm, char * pBuffer )
{
    SC_Pin * pPin; int i;
    char * pTemp, * pLimit;
    for ( pTemp = pForm; *pTemp; )
    {
        if ( !Abc_SclIsChar(*pTemp) )
        {
            *pBuffer++ = *pTemp++;
            continue;
        }
        pLimit = Abc_SclFindLimit( pTemp );
        SC_CellForEachPinIn( pCell, pPin, i )
            if ( Abc_SclAreEqual( pPin->pName, pTemp, pLimit ) )
            {
                *pBuffer++ = 'a' + i;
                break;
            }
        assert( i < pCell->n_inputs );
        pTemp = pLimit;
    }
    *pBuffer++ = 0;
}